

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Syndicated_Action.cpp
# Opt level: O2

bool __thiscall
SRUP_MSG_SYNDICATED_ACTION::targetID(SRUP_MSG_SYNDICATED_ACTION *this,uint64_t *target)

{
  uint64_t *puVar1;
  
  operator_delete(this->m_target_ID);
  puVar1 = (uint64_t *)operator_new(8);
  this->m_target_ID = puVar1;
  *puVar1 = *target;
  return true;
}

Assistant:

bool SRUP_MSG_SYNDICATED_ACTION::targetID(const uint64_t *target)
{
    try
    {
        delete(m_target_ID);

        m_target_ID = new uint64_t;
        std::memcpy(m_target_ID, target, sizeof(*target));
    }
    catch (...)
    {
        m_target_ID = nullptr;
        return false;
    }
    return true;
}